

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_buffer_stream.h
# Opt level: O0

ssize_t __thiscall
crnlib::buffer_stream::read(buffer_stream *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  undefined4 in_register_00000034;
  uint bytes_left;
  uint local_4;
  
  if (((((this->super_data_stream).field_0x1a & 1) == 0) ||
      (bVar1 = data_stream::is_readable((data_stream *)0x13126d), !bVar1)) || ((uint)__buf == 0)) {
    local_4 = 0;
  }
  else {
    local_4 = math::minimum<unsigned_int>((uint)__buf,this->m_size - this->m_ofs);
    if (local_4 != 0) {
      memcpy((void *)CONCAT44(in_register_00000034,__fd),this->m_pBuf + this->m_ofs,(ulong)local_4);
    }
    this->m_ofs = local_4 + this->m_ofs;
  }
  return (ulong)local_4;
}

Assistant:

virtual uint read(void* pBuf, uint len) {
    CRNLIB_ASSERT(pBuf && (len <= 0x7FFFFFFF));

    if ((!m_opened) || (!is_readable()) || (!len))
      return 0;

    CRNLIB_ASSERT(m_ofs <= m_size);

    uint bytes_left = m_size - m_ofs;

    len = math::minimum<uint>(len, bytes_left);

    if (len)
      memcpy(pBuf, &m_pBuf[m_ofs], len);

    m_ofs += len;

    return len;
  }